

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzvec.h
# Opt level: O3

int64_t __thiscall TPZSkylMatrix<double>::SkyHeight(TPZSkylMatrix<double> *this,int64_t col)

{
  double **ppdVar1;
  
  ppdVar1 = (this->fElem).fStore;
  return ((long)ppdVar1[col + 1] - (long)ppdVar1[col] >> 3) + -1;
}

Assistant:

T& operator[]( const int64_t index ) const
	{
#ifdef PZDEBUG
		if( index < 0 || index >= fNElements )
		{
            PZError << __PRETTY_FUNCTION__ << " acessing element out of range.";
            PZError << "|" << std::endl;
            PZError << "+-> NElements = " << NElements() << std::endl;
            PZError << "|" << std::endl;
            PZError << "+-> Index = " << index << std::endl;
            DebugStop();
            exit( -1 );
		}
#endif
		return fStore[ index ];
	}